

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O0

JsonNumber * __thiscall
json::JsonObject::setChild<json::JsonNumber,double>(JsonObject *this,string *name,double arg)

{
  JsonNumber *pJVar1;
  type this_00;
  mapped_type *this_01;
  Value local_50;
  JsonNumber *local_40;
  JsonNumber *ref;
  unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> local_28;
  unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_> child;
  double arg_local;
  string *name_local;
  JsonObject *this_local;
  
  child._M_t.super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>._M_t.
  super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
  super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<json::JsonNode,_std::default_delete<json::JsonNode>,_true,_true>)
       (__uniq_ptr_data<json::JsonNode,_std::default_delete<json::JsonNode>,_true,_true>)arg;
  pJVar1 = (JsonNumber *)operator_new(0x18);
  JsonNumber::JsonNumber
            (pJVar1,&this->super_JsonNode,
             (double)child._M_t.
                     super___uniq_ptr_impl<json::JsonNode,_std::default_delete<json::JsonNode>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_json::JsonNode_*,_std::default_delete<json::JsonNode>_>.
                     super__Head_base<0UL,_json::JsonNode_*,_false>._M_head_impl);
  std::unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>>::
  unique_ptr<std::default_delete<json::JsonNode>,void>
            ((unique_ptr<json::JsonNode,std::default_delete<json::JsonNode>> *)&local_28,
             (pointer)pJVar1);
  this_00 = std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::operator*
                      (&local_28);
  local_40 = JsonNode::operator_cast_to_JsonNumber_(this_00);
  std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::unique_ptr
            (&local_50.node,&local_28);
  local_50.orderIndex = this->childCounter;
  this->childCounter = local_50.orderIndex + 1;
  this_01 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>_>
            ::operator[](&this->children,name);
  Value::operator=(this_01,&local_50);
  Value::~Value(&local_50);
  pJVar1 = local_40;
  std::unique_ptr<json::JsonNode,_std::default_delete<json::JsonNode>_>::~unique_ptr(&local_28);
  return pJVar1;
}

Assistant:

ChildType &JsonObject::setChild(const std::string &name, ArgType arg)
    {
        std::unique_ptr<JsonNode> child(new ChildType(this, arg));
        ChildType &ref = *child;
        children[name] = {std::move(child), childCounter++};
        return ref;
    }